

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

bool lest::match(texts *whats,text *line)

{
  pointer pcVar1;
  bool bVar2;
  pointer pbVar3;
  text local_70;
  text local_50;
  
  pbVar3 = (whats->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 == (whats->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = false;
  }
  else {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + pbVar3->_M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (line->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + line->_M_string_length);
      bVar2 = search(&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while ((!bVar2) &&
            (pbVar3 = pbVar3 + 1,
            pbVar3 != (whats->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish));
  }
  return bVar2;
}

Assistant:

operator bool() { bool result = once; once = false; return result; }